

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O1

string * __thiscall
TwoStageDynamicBayesianNetwork::SoftPrintSoI_O_abi_cxx11_
          (string *__return_storage_ptr__,TwoStageDynamicBayesianNetwork *this,Index agI)

{
  pointer pSVar1;
  ostream *poVar2;
  ulong uVar3;
  ulong uVar4;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"agI=",4);
  uVar4 = (ulong)agI;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", XSoI_O=",9);
  pSVar1 = (this->_m_XSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_m_XSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    poVar2 = ::operator<<(poVar2,pSVar1 + uVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ASoI_O=",9);
    pSVar1 = (this->_m_ASoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar3 = ((long)(this->_m_ASoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
    if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
      poVar2 = ::operator<<(poVar2,pSVar1 + uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,", YSoI_O=",9);
      pSVar1 = (this->_m_YSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar3 = ((long)(this->_m_YSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
      if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
        poVar2 = ::operator<<(poVar2,pSVar1 + uVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,", OSoI_O=",9);
        pSVar1 = (this->_m_OSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar3 = ((long)(this->_m_OSoI_O).super__Vector_base<Scope,_std::allocator<Scope>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pSVar1 >> 3) * -0x5555555555555555;
        if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
          ::operator<<(poVar2,pSVar1 + uVar4);
          std::__cxx11::stringbuf::str();
          std::__cxx11::stringstream::~stringstream(asStack_1b8);
          std::ios_base::~ios_base(local_138);
          return __return_storage_ptr__;
        }
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

string TwoStageDynamicBayesianNetwork::SoftPrintSoI_O(Index agI) const
{
    stringstream ss;
    ss << "agI=" << agI <<
        ", XSoI_O=" << _m_XSoI_O.at(agI) << 
        ", ASoI_O=" << _m_ASoI_O.at(agI) << 
        ", YSoI_O=" << _m_YSoI_O.at(agI) << 
        ", OSoI_O=" << _m_OSoI_O.at(agI);
    return(ss.str());
}